

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall deqp::egl::GLES2ThreadTest::RenderTexture::exec(RenderTexture *this,Thread *t)

{
  ostream *poVar1;
  deUint32 dVar2;
  int iVar3;
  Thread *pTVar4;
  float coords [12];
  undefined1 local_1e8 [136];
  ios_base local_160 [264];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  pTVar4 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar4 != (Thread *)0x0) {
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"Begin -- glClearColor(0.5f, 0.5f, 0.5f, 1.0f)",0x2d);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1c0))
              (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"clearColor(0.5f, 0.5f, 0.5f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6de);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glClearColor()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"Begin -- glClear(GL_COLOR_BUFFER_BIT)",0x25);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x188))(0x4000);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6e2);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glClear()",0x10);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glUseProgram(",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1680))
              (((this->m_program).m_ptr)->program);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"useProgram(m_program->program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6e6);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glUseProgram()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glBindTexture(GL_TEXTURE_2D, ",0x26);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0xb8))
              (0xde1,((this->m_texture).m_ptr)->texture);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6ea);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glBindTexture()",0x16);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glGetUniformLocation(",0x1e)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", \"u_sampler\")",0xe);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    iVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0xb48))
                      (((this->m_program).m_ptr)->program,"u_sampler");
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"glGetUniformLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6ef);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glGetUniformLocation()",0x1d);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glUniform1i(",0x15);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", 0)",4);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x14f0))(iVar3,0);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"uniform1i(samplerPos, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6f3);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glUniform1i()",0x14);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glGetAttribLocation(",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", \"a_pos\")",10);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    iVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x780))
                      (((this->m_program).m_ptr)->program,"a_pos");
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6f9);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End -- ",7);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = glGetAttribLocation()",0x18);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glEnableVertexAttribArray(",0x23);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x610))(iVar3);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"enableVertexAttribArray(posLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x6fd);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glEnableVertexAttribArray()",0x22);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)",0x29);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x40))(0x8892,0);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x701);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glBindBuffer()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_38 = 0x3f800000bf800000;
    uStack_30 = 0xbf800000bf800000;
    local_48 = &DAT_3f8000003f800000;
    puStack_40 = &DAT_3f8000003f800000;
    local_58 = 0xbf800000bf800000;
    uStack_50 = 0xbf8000003f800000;
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glVertexAttribPointer(",0x1f);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,", GL_FLOAT, GL_FALSE, 0, <data>)",0x20);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x19f0))(iVar3,2,0x1406,0,0,&local_58)
    ;
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"vertexAttribPointer(posLoc, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x710);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glVertexAttribPointer()",0x1e);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"Begin -- glDrawArrays(GL_TRIANGLES, 0, 6)",0x29);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x538))(4,0,6);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"drawArrays(GL_TRIANGLES, 0, 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x714);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glDrawArrays()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)",0x29);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x40))(0x8892,0);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x718);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glBindBuffer()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"Begin -- glBindTexture(GL_TEXTURE_2D, 0)",0x28);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0xb8))(0xde1,0);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x71c);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glBindTexture()",0x16);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    poVar1 = (ostream *)(local_1e8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glDisableVertexAttribArray(",0x24);
    std::ostream::operator<<(poVar1,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x518))(iVar3);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"disableVertexAttribArray(posLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x720);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glDisableVertexAttribArray()",0x23);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"Begin -- glUseProgram(0)",0x18);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x1680))(0);
    dVar2 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"useProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x724);
    local_1e8._0_8_ = pTVar4;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e8 + 0x18),"End -- glUseProgram()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 8));
    std::ios_base::~ios_base(local_160);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void RenderTexture::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glClearColor(0.5f, 0.5f, 0.5f, 1.0f)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, clearColor(0.5f, 0.5f, 0.5f, 1.0f));
	thread.newMessage() << "End -- glClearColor()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glClear(GL_COLOR_BUFFER_BIT)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, clear(GL_COLOR_BUFFER_BIT));
	thread.newMessage() << "End -- glClear()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUseProgram(" << m_program->program << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, useProgram(m_program->program));
	thread.newMessage() << "End -- glUseProgram()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glGetUniformLocation(" << m_program->program << ", \"u_sampler\")" << tcu::ThreadUtil::Message::End;
	GLint samplerPos = thread.gl.getUniformLocation(m_program->program, "u_sampler");
	GLU_CHECK_GLW_MSG(thread.gl, "glGetUniformLocation()");
	thread.newMessage() << "End -- glGetUniformLocation()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUniform1i(" << samplerPos << ", 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, uniform1i(samplerPos, 0));
	thread.newMessage() << "End -- glUniform1i()" << tcu::ThreadUtil::Message::End;


	thread.newMessage() << "Begin -- glGetAttribLocation(" << m_program->program << ", \"a_pos\")" << tcu::ThreadUtil::Message::End;
	GLint posLoc = thread.gl.getAttribLocation(m_program->program, "a_pos");
	GLU_CHECK_GLW_MSG(thread.gl, "glGetAttribLocation()");
	thread.newMessage() << "End -- " << posLoc << " = glGetAttribLocation()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glEnableVertexAttribArray(" << posLoc << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, enableVertexAttribArray(posLoc));
	thread.newMessage() << "End -- glEnableVertexAttribArray()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(GL_ARRAY_BUFFER, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;


	float coords[] = {
		-1.0, -1.0,
		 1.0, -1.0,
		 1.0,  1.0,

		 1.0,  1.0,
		-1.0,  1.0,
		-1.0, -1.0
	};

	thread.newMessage() << "Begin -- glVertexAttribPointer(" << posLoc << ", GL_FLOAT, GL_FALSE, 0, <data>)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, vertexAttribPointer(posLoc, 2, GL_FLOAT, GL_FALSE, 0, coords));
	thread.newMessage() << "End -- glVertexAttribPointer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glDrawArrays(GL_TRIANGLES, 0, 6)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, drawArrays(GL_TRIANGLES, 0, 6));
	thread.newMessage() << "End -- glDrawArrays()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(GL_ARRAY_BUFFER, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(GL_ARRAY_BUFFER, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glDisableVertexAttribArray(" << posLoc << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, disableVertexAttribArray(posLoc));
	thread.newMessage() << "End -- glDisableVertexAttribArray()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glUseProgram(0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, useProgram(0));
	thread.newMessage() << "End -- glUseProgram()" << tcu::ThreadUtil::Message::End;
}